

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

boolean exist_artifact(int otyp,char *name)

{
  int iVar1;
  boolean *local_28;
  boolean *arex;
  artifact *a;
  char *name_local;
  int otyp_local;
  
  if ((otyp != 0) && (*name != '\0')) {
    local_28 = artiexist;
    for (arex = (boolean *)(artilist + 1); local_28 = local_28 + 1, *(short *)(arex + 0x3a) != 0;
        arex = arex + 0x40) {
      if ((*(short *)(arex + 0x3a) == otyp) && (iVar1 = strcmp(*(char **)arex,name), iVar1 == 0)) {
        return *local_28;
      }
    }
  }
  return '\0';
}

Assistant:

boolean exist_artifact(int otyp, const char *name)
{
	const struct artifact *a;
	boolean *arex;

	if (otyp && *name)
	    for (a = artilist+1,arex = artiexist+1; a->otyp; a++,arex++)
		if ((int) a->otyp == otyp && !strcmp(a->name, name))
		    return *arex;
	return FALSE;
}